

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupMenuFile(CEditor *this,void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  char *pTitle;
  bool bVar4;
  char *pButtonText;
  long in_FS_OFFSET;
  code *pfnFunc;
  CUIRect Slot;
  CUIRect View_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  CUIRect::HSplitTop(&View_local,2.0,&Slot,&View_local);
  CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
  iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_NewMapButton,"New",0,&Slot,0,"Creates a new map")
  ;
  if (iVar2 == 0) {
    CUIRect::HSplitTop(&View_local,10.0,&Slot,&View_local);
    CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
    iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_OpenButton,"Load",0,&Slot,0,
                              "Opens a map for editing");
    if (iVar2 == 0) {
      if (this->m_pClient->m_State == 3) {
        CUIRect::HSplitTop(&View_local,2.0,&Slot,&View_local);
        CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
        iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_OpenCurrentButton,"Load Current Map",0,
                                  &Slot,0,"Opens the current in game map for editing");
        if (iVar2 != 0) {
          iVar2 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
          if ((char)iVar2 == '\0') {
            LoadCurrentMap(this);
            goto LAB_0019c472;
          }
          uVar3 = 0x100000002;
          goto LAB_0019c2ee;
        }
      }
      CUIRect::HSplitTop(&View_local,10.0,&Slot,&View_local);
      CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
      iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_AppendButton,"Append",0,&Slot,0,
                                "Opens a map and adds everything from that map to the current one");
      if (iVar2 != 0) {
        pfnFunc = CallbackAppendMap;
        pTitle = "Append map";
        pButtonText = "Append";
        goto LAB_0019c45e;
      }
      CUIRect::HSplitTop(&View_local,10.0,&Slot,&View_local);
      CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
      iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_SaveButton,"Save",0,&Slot,0,
                                "Saves the current map");
      if (iVar2 == 0) {
        CUIRect::HSplitTop(&View_local,2.0,&Slot,&View_local);
        CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
        iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_SaveAsButton,"Save As",0,&Slot,0,
                                  "Saves the current map under a new name");
        if (iVar2 != 0) goto LAB_0019c5aa;
        CUIRect::HSplitTop(&View_local,10.0,&Slot,&View_local);
        CUIRect::HSplitTop(&View_local,12.0,&Slot,&View_local);
        bVar4 = false;
        iVar2 = DoButton_MenuItem(this,&PopupMenuFile::s_ExitButton,"Exit",0,&Slot,0,
                                  "Exits from the editor");
        if (iVar2 == 0) goto LAB_0019c475;
        iVar2 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
        if ((char)iVar2 == '\0') {
          this->m_pConfig->m_ClEditor = 0;
          goto LAB_0019c472;
        }
        uVar3 = 0x100000000;
LAB_0019c2ee:
        this->m_PopupEventType = (int)uVar3;
        this->m_PopupEventActivated = (int)((ulong)uVar3 >> 0x20);
        goto LAB_0019c472;
      }
      if ((this->m_aFileName[0] != '\0') && (this->m_ValidSaveFilename == true)) {
        str_copy(this->m_aFileSaveName,this->m_aFileName,0x200);
        uVar3 = 0x100000004;
        goto LAB_0019c2ee;
      }
LAB_0019c5aa:
      pfnFunc = CallbackSaveMap;
      pTitle = "Save map";
      pButtonText = "Save";
      iVar2 = 0;
    }
    else {
      iVar2 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
      if ((char)iVar2 != '\0') {
        uVar3 = 0x100000001;
        goto LAB_0019c2ee;
      }
      pfnFunc = CallbackOpenMap;
      pTitle = "Load map";
      pButtonText = "Load";
LAB_0019c45e:
      iVar2 = -1;
    }
    InvokeFileDialog(this,iVar2,0,pTitle,pButtonText,"maps","",pfnFunc,this);
  }
  else {
    iVar2 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
    if ((char)iVar2 != '\0') {
      uVar3 = 0x100000003;
      goto LAB_0019c2ee;
    }
    Reset(this,true);
    this->m_aFileName[0] = '\0';
  }
LAB_0019c472:
  bVar4 = true;
LAB_0019c475:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupMenuFile(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	static int s_NewMapButton = 0;
	static int s_SaveButton = 0;
	static int s_SaveAsButton = 0;
	static int s_OpenButton = 0;
	static int s_OpenCurrentButton = 0;
	static int s_AppendButton = 0;
	static int s_ExitButton = 0;

	CUIRect Slot;
	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_NewMapButton, "New", 0, &Slot, 0, "Creates a new map"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_NEW;
			pEditor->m_PopupEventActivated = true;
		}
		else
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_OpenButton, "Load", 0, &Slot, 0, "Opens a map for editing"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_LOAD;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		return true;
	}

	if(pEditor->Client()->State() == IClient::STATE_ONLINE)
	{
		View.HSplitTop(2.0f, &Slot, &View);
		View.HSplitTop(12.0f, &Slot, &View);
		if(pEditor->DoButton_MenuItem(&s_OpenCurrentButton, "Load Current Map", 0, &Slot, 0, "Opens the current in game map for editing"))
		{
			if(pEditor->HasUnsavedData())
			{
				pEditor->m_PopupEventType = POPEVENT_LOAD_CURRENT;
				pEditor->m_PopupEventActivated = true;
			}
			else
				pEditor->LoadCurrentMap();
			return true;
		}
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_AppendButton, "Append", 0, &Slot, 0, "Opens a map and adds everything from that map to the current one"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Append map", "Append", "maps", "", pEditor->CallbackAppendMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveButton, "Save", 0, &Slot, 0, "Saves the current map"))
	{
		if(pEditor->m_aFileName[0] && pEditor->m_ValidSaveFilename)
		{
			str_copy(pEditor->m_aFileSaveName, pEditor->m_aFileName, sizeof(pEditor->m_aFileSaveName));
			pEditor->m_PopupEventType = POPEVENT_SAVE;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveAsButton, "Save As", 0, &Slot, 0, "Saves the current map under a new name"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_ExitButton, "Exit", 0, &Slot, 0, "Exits from the editor"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_EXIT;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->Config()->m_ClEditor = 0;
		return true;
	}

	return false;
}